

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O2

void __thiscall sophia_interface::LUEXEC(sophia_interface *this)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  double (*padVar8) [4000];
  double *pdVar9;
  long lVar10;
  double *pdVar11;
  sophia_interface *psVar12;
  sophia_interface *this_00;
  int iVar13;
  double (*padVar14) [4000];
  long lVar15;
  int I_1;
  int I;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [40];
  int aiStack_e0 [2];
  double dStack_d8;
  double PS [6] [2];
  double local_68;
  double local_58;
  allocator local_31;
  
  PS[4][1] = 0.0;
  PS[5][0] = 0.0;
  PS[3][1] = 0.0;
  PS[4][0] = 0.0;
  PS[2][1] = 0.0;
  PS[3][0] = 0.0;
  PS[1][1] = 0.0;
  PS[2][0] = 0.0;
  MSTU[0x17] = 0;
  PS[0][1] = 0.0;
  PS[1][0] = 0.0;
  dStack_d8 = 0.0;
  PS[0][0] = 0.0;
  psVar12 = this;
  if (0 < MSTU[0xb]) {
    psVar12 = (sophia_interface *)local_148;
    std::__cxx11::string::string((string *)psVar12,"LULIST(0), Method removed.",&local_31);
    LUERRM(psVar12,-1,(string *)local_148);
    psVar12 = (sophia_interface *)local_148;
    std::__cxx11::string::~string((string *)psVar12);
  }
  MSTU[0x1e] = MSTU[0x1e] + 1;
  MSTU[0] = 0;
  MSTU[1] = 0;
  MSTU[2] = 0;
  if (MSTU[0x10] < 1) {
    MSTU[0x59] = 0;
  }
  iVar7 = this->N;
  padVar14 = this->P;
  local_68 = 0.0;
  PS[5][1] = (double)padVar14;
  iVar4 = iVar7;
  for (lVar17 = 0; lVar17 < iVar4; lVar17 = lVar17 + 1) {
    if (0xfffffff5 < this->K[0][lVar17] - 0xbU) {
      padVar8 = padVar14;
      for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
        *(double *)((long)PS[-1] + lVar10 + 8) =
             (*padVar8)[0] + *(double *)((long)PS[-1] + lVar10 + 8);
        padVar8 = padVar8 + 1;
      }
      iVar4 = LUCHGE(psVar12,this->K[1][lVar17]);
      local_68 = (double)iVar4 + PS[4][1];
      PS[4][1] = local_68;
      iVar4 = this->N;
    }
    padVar14 = (double (*) [4000])(*padVar14 + 1);
  }
  local_108._32_8_ = PS[2][1];
  aiStack_e0[0] = 0;
  aiStack_e0[1] = 0;
  PARU[0x14] = PS[2][1];
  psVar12 = this;
  LUPREP(this,0);
  bVar2 = true;
  bVar1 = 1;
  bVar3 = false;
  do {
    lVar17 = 0;
    do {
      lVar10 = lVar17 + 1;
      iVar4 = this->K[0][lVar17];
      if (iVar4 - 1U < 10) {
        iVar13 = this->K[1][lVar17];
        iVar5 = LUCOMP(psVar12,iVar13);
        if (iVar5 != 0) {
          iVar16 = (int)lVar17;
          if (KCHG[0][(long)iVar5 + 499] == 0) {
            if ((0 < MSTJ[0x14]) && (0 < MDCY[-1][(long)iVar5 + 499])) {
              if (0 < MSTJ[0x32] && !bVar3) {
                iVar4 = -iVar13;
                if (0 < iVar13) {
                  iVar4 = iVar13;
                }
                if ((PMAS[0][(long)iVar5 + 499] < PARJ[0x5a]) && (iVar4 != 0x137))
                goto LAB_0010d40f;
              }
              psVar12 = this;
              LUDECY(this,iVar16 + 1);
            }
LAB_0010d40f:
            iVar4 = MSTJ[0x5b];
            lVar15 = (long)MSTJ[0x5b];
            if (lVar15 < 1) {
              if (MSTJ[0x5b] < 0) {
                iVar4 = -MSTJ[0x5b];
                LUSHOW(this,iVar4,-3,this->P[4][lVar17]);
                psVar12 = this;
                LUPREP(this,iVar4);
                MSTJ[0x5b] = 0;
              }
            }
            else {
              uVar6 = MSTJ[0x5b] - 1;
              dVar18 = this->P[3][uVar6] + this->P[3][lVar15];
              dVar19 = this->P[0][uVar6] + this->P[0][lVar15];
              dVar20 = this->P[1][uVar6] + this->P[1][lVar15];
              dVar21 = this->P[2][uVar6] + this->P[2][lVar15];
              dVar18 = ((dVar18 * dVar18 - dVar19 * dVar19) - dVar20 * dVar20) - dVar21 * dVar21;
              if (dVar18 <= 0.0) {
                dVar18 = 0.0;
              }
              LUSHOW(this,MSTJ[0x5b],MSTJ[0x5b] + 1,SQRT(dVar18));
              psVar12 = this;
              LUPREP(this,iVar4);
              MSTJ[0x5b] = 0;
            }
          }
          else if (iVar4 - 1U < 2) {
            iVar13 = MSTJ[0];
            if (0 < MSTJ[0]) {
              iVar13 = 2;
            }
            if (iVar4 != 1) {
              iVar13 = MSTJ[0];
            }
            if ((((MSTJ[0x14] < 2) || (iVar4 != 2)) || (this->N <= lVar10)) ||
               (((this->K[0][lVar17 + 1] != 1 || (iVar4 = this->K[2][lVar17], lVar17 < iVar4)) ||
                ((iVar5 = this->K[2][lVar17 + 1], iVar5 != iVar4 ||
                 ((iVar4 < 1 ||
                  (iVar4 = LUCOMP(psVar12,this->K[1][iVar5 - 1]), KCHG[0][(long)iVar4 + 499] != 0)))
                 ))))) {
              if (iVar13 == 2) {
                LUINDF(this,iVar16 + 1);
                psVar12 = (sophia_interface *)0x5;
                if (MSTJ[2] < 1) {
                  bVar2 = false;
                }
                if (this->K[0][lVar17] == 1) {
                  bVar2 = false;
                }
                if ((uint)MSTJ[2] % 5 == 0) {
                  bVar2 = false;
                }
              }
              else if (iVar13 == 1) goto LAB_0010d551;
            }
            else if (0 < iVar13) {
LAB_0010d551:
              psVar12 = this;
              LUSTRF(this,iVar16 + 1);
            }
          }
        }
      }
      if (((MSTU[0x17] != 0) && (1 < MSTU[0x14])) || (this->N <= lVar10)) goto LAB_0010d595;
      lVar17 = lVar10;
    } while (this->N < (MSTU[3] - MSTU[0x1f]) + -0x14);
    psVar12 = (sophia_interface *)local_168;
    this_00 = psVar12;
    std::__cxx11::string::string
              ((string *)psVar12,"LUEXEC: no more memory left in LUJETS",&local_31);
    LUERRM(this_00,0xb,(string *)psVar12);
    std::__cxx11::string::~string((string *)psVar12);
LAB_0010d595:
    if (!(bool)(bVar1 & 0 < MSTJ[0x32])) {
      local_58 = 0.0;
      pdVar11 = (double *)PS[5][1];
      for (lVar17 = 0; lVar17 < this->N; lVar17 = lVar17 + 1) {
        if (0xfffffff5 < this->K[0][lVar17] - 0xbU) {
          pdVar9 = pdVar11;
          for (lVar10 = 0; lVar10 != 0x40; lVar10 = lVar10 + 0x10) {
            *(double *)((long)PS[0] + lVar10) = *pdVar9 + *(double *)((long)PS[0] + lVar10);
            pdVar9 = pdVar9 + 4000;
          }
          iVar7 = LUCHGE(psVar12,this->K[1][lVar17]);
          local_58 = (double)iVar7 + PS[5][0];
          PS[5][0] = local_58;
        }
        pdVar11 = pdVar11 + 1;
      }
      if (bVar2) {
        if (PARU[10] <
            (ABS(PS[0][0] - dStack_d8) + ABS(PS[1][0] - PS[0][1]) + ABS(PS[2][0] - PS[1][1]) +
            ABS(PS[3][0] - (double)local_108._32_8_)) /
            (ABS(PS[3][0]) + 1.0 + ABS((double)local_108._32_8_))) {
          psVar12 = (sophia_interface *)local_128;
          std::__cxx11::string::string
                    ((string *)psVar12,"LUEXEC: four-momentum was not conserved",&local_31);
          LUERRM(psVar12,0xf,(string *)local_128);
          std::__cxx11::string::~string((string *)local_128);
        }
        if (0.1 < ABS(local_58 - local_68)) {
          psVar12 = (sophia_interface *)local_108;
          std::__cxx11::string::string
                    ((string *)psVar12,"LUEXEC: charge was not conserved",&local_31);
          LUERRM(psVar12,0xf,(string *)local_108);
          std::__cxx11::string::~string((string *)local_108);
        }
      }
      return;
    }
    psVar12 = this;
    LUBOEI(this,iVar7);
    bVar3 = true;
    bVar1 = 0;
  } while( true );
}

Assistant:

void sophia_interface::LUEXEC() {
// Purpose: to administrate the fragmentation and decay chain.
    double PS[6][2] = {0.};

    // Initialize and reset.
    MSTU[23] = 0;
    if (MSTU[11] >= 1) LUERRM(-1, "LULIST(0), Method removed.");
    MSTU[30]++;
    MSTU[0] = 0;
    MSTU[1] = 0;
    MSTU[2] = 0;
    if (MSTU[16] <= 0) MSTU[89] = 0;
    int MCONS = 1;

    // Sum up momentum, energy and charge for starting entries.
    int NSAV = N;
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][0] += P[J][I];
        }
        PS[5][0] += LUCHGE(K[1][I]);
    }
    PARU[20] = PS[3][0];

    // Prepare system for subsequent fragmentation/decay.
    LUPREP(0);

    // Loop through jet fragmentation and particle decays.
    int MBE = 0;
    bool repeat140 = false;
    do {  // 140
        repeat140 = false;
        MBE++;
        int IP = 0;

        bool repeat150 = false;
        do {  // 150
            repeat150 = false;
            IP++;
            int KC = 0;
            if (K[0][IP - 1] > 0 && K[0][IP - 1] <= 10) KC = LUCOMP(K[1][IP - 1]);
            if (KC == 0) {
                // do nothing
            // Particle decay if unstable and allowed. Save long-lived particle
            // decays until second pass after Bose-Einstein effects.
            } else if (KCHG[1][KC - 1] == 0) {
                if (MSTJ[20] >= 1 && MDCY[0][KC - 1] >= 1 && (MSTJ[50] <= 0 || MBE == 2 || PMAS[1][KC - 1] >= PARJ[90] || std::abs(K[1][IP - 1]) == 311)) {
                    LUDECY(IP);
                }

                // Decay products may develop a shower.
                if (MSTJ[91] > 0) {
                    int IP1 = MSTJ[91];
                    double QMAX = std::sqrt(std::max(0., (P[3][IP1 - 1] + P[3][IP1]) * (P[3][IP1 - 1] + P[3][IP1]) - (P[0][IP1 - 1] + P[0][IP1]) * (P[0][IP1 - 1] + P[0][IP1]) - (P[1][IP1 - 1] + P[1][IP1]) * (P[1][IP1 - 1] + P[1][IP1]) - (P[2][IP1 - 1] + P[2][IP1]) * (P[2][IP1 - 1] + P[2][IP1])));
                    LUSHOW(IP1, IP1 + 1, QMAX);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                } else if (MSTJ[91] < 0) {
                    int IP1 = -MSTJ[91];
                    LUSHOW(IP1, -3, P[4][IP - 1]);
                    LUPREP(IP1);
                    MSTJ[91] = 0;
                }

            // Jet fragmentation: string or independent fragmentation.
            } else if (K[0][IP - 1] == 1 || K[0][IP - 1] == 2) {
                int MFRAG = MSTJ[0];
                if (MFRAG >= 1 && K[0][IP - 1] == 1) MFRAG = 2;
                if (MSTJ[20] >= 2 && K[0][IP - 1] == 2 && N > IP) {
                    if (K[0][IP] == 1 && K[2][IP] == K[2][IP - 1] && K[2][IP - 1] > 0 && K[2][IP - 1] < IP) {
                        if (KCHG[1][LUCOMP(K[1][K[2][IP - 1] - 1]) - 1] == 0) MFRAG = std::min(1, MFRAG);
                    }
                }

                if (MFRAG == 1) LUSTRF(IP);
                if (MFRAG == 2) LUINDF(IP);

                if (MFRAG == 2 && K[0][IP - 1] == 1) MCONS = 0;
                if (MFRAG == 2 && (MSTJ[2] <= 0 || MSTJ[2] % 5 == 0)) MCONS = 0;
            }

            // Loop back if enough space left in LUJETS and no error abort.
            if (MSTU[23] != 0 && MSTU[20] >= 2) {
                // do nothing
            } else if (IP < N && N < MSTU[3] - 20 - MSTU[31]) {
                repeat150 = true;
                continue;
            } else if (IP < N) {
                LUERRM(11, "LUEXEC: no more memory left in LUJETS");
            }
        } while (repeat150);  // 150

        // Include simple Bose-Einstein effect parametrization if desired.
        if (MBE == 1 && MSTJ[50] >= 1) {
            LUBOEI(NSAV);
            repeat140 = true;
            continue;
        }
    } while (repeat140);  // 140

    // Check that momentum, energy and charge were conserved.
    for (int I = 0; I < N; ++I) {
        if (K[0][I] <= 0 || K[0][I] > 10) continue;
        for (int J = 0; J < 4; ++J) {
            PS[J][1] += P[J][I];
        }
        PS[5][1] += LUCHGE(K[1][I]);
    }
    double PDEV = (std::abs(PS[0][1] - PS[0][0]) + std::abs(PS[1][1] - PS[1][0]) + std::abs(PS[2][1] - PS[2][0]) + std::abs(PS[3][1] - PS[3][0])) / (1. + std::abs(PS[3][1]) + std::abs(PS[3][0]));
    if (MCONS == 1 && PDEV > PARU[10]) LUERRM(15, "LUEXEC: four-momentum was not conserved");
    if (MCONS == 1 && std::abs(PS[5][1] - PS[5][0]) > 0.1) LUERRM(15, "LUEXEC: charge was not conserved");
    return;
}